

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.hpp
# Opt level: O1

TestInstance * __thiscall
vkt::texture::util::
TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DArrayShadowTestInstance>::
createInstance(TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DArrayShadowTestInstance>
               *this,Context *context)

{
  Context **this_00;
  deInt32 *pdVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  int i;
  deUint32 dVar5;
  deUint32 dVar6;
  TestInstance *pTVar7;
  long lVar8;
  TextureFormat this_01;
  long lVar9;
  _func_int **pp_Var10;
  Context *pCVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  deUint32 step;
  ulong uVar16;
  Context *pCVar17;
  int iVar18;
  Context *pCVar19;
  int levelNdx;
  ulong uVar20;
  _func_int **pp_Var21;
  bool bVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  Vec4 gMax;
  Vector<float,_4> res_3;
  Vec4 cScale;
  Vector<float,_4> res_7;
  Vec4 cBias;
  Vec4 gMin;
  Vector<float,_4> res_6;
  TextureFormatInfo fmtInfo;
  Vec4 local_198;
  TextureRenderer *local_180;
  Context *local_178;
  uint local_170;
  uint local_16c;
  undefined8 local_168;
  undefined8 uStack_160;
  float local_158 [4];
  Vec4 local_148;
  float local_138 [4];
  undefined1 local_128 [8];
  undefined8 uStack_120;
  float afStack_118 [9];
  uint local_f4;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined4 local_e0;
  undefined4 local_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined4 local_c8;
  undefined8 local_c4;
  undefined8 uStack_bc;
  undefined8 local_b4;
  undefined8 local_ac;
  undefined8 uStack_a4;
  undefined4 local_9c;
  float local_98 [6];
  RGBA local_80 [4];
  TextureFormatInfo local_70;
  
  pTVar7 = (TestInstance *)operator_new(0x288);
  pTVar7->m_context = context;
  pTVar7->_vptr_TestInstance = (_func_int **)&PTR__Texture2DArrayShadowTestInstance_00d68150;
  pTVar7[1]._vptr_TestInstance = (_func_int **)&this->m_testsParameters;
  this_00 = &pTVar7[1].m_context;
  local_180 = (TextureRenderer *)&pTVar7[4].m_context;
  pTVar7[1].m_context = (Context *)0x0;
  pTVar7[2]._vptr_TestInstance = (_func_int **)0x0;
  pTVar7[2].m_context = (Context *)0x0;
  pTVar7[3]._vptr_TestInstance = (_func_int **)0x0;
  pTVar7[3].m_context = (Context *)0x0;
  pTVar7[4]._vptr_TestInstance = (_func_int **)0x0;
  TextureRenderer::TextureRenderer
            (local_180,context,
             (this->m_testsParameters).super_Texture2DArrayTestCaseParameters.
             super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.sampleCount,
             0x40,0x40);
  *(undefined4 *)&pTVar7[0x28]._vptr_TestInstance = 0;
  pp_Var10 = pTVar7[1]._vptr_TestInstance;
  uVar14 = *(uint *)((long)pp_Var10 + 0x44);
  if ((int)*(uint *)((long)pp_Var10 + 0x44) < (int)*(uint *)(pp_Var10 + 8)) {
    uVar14 = *(uint *)(pp_Var10 + 8);
  }
  uVar13 = 0x20;
  if (uVar14 != 0) {
    uVar13 = 0x1f;
    if (uVar14 != 0) {
      for (; uVar14 >> uVar13 == 0; uVar13 = uVar13 - 1) {
      }
    }
    uVar13 = uVar13 ^ 0x1f;
  }
  local_128 = (undefined1  [8])::vk::mapVkFormat(*(VkFormat *)(pp_Var10 + 4));
  tcu::getTextureFormatInfo(&local_70,(TextureFormat *)local_128);
  iVar12 = 0x1f - uVar13;
  local_158[0] = 0.0;
  local_158[1] = 0.0;
  local_158[2] = 0.0;
  local_158[3] = 0.0;
  lVar8 = 0;
  do {
    local_158[lVar8] = local_70.valueMax.m_data[lVar8] - local_70.valueMin.m_data[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  local_138[0] = local_70.valueMin.m_data[0];
  local_138[1] = local_70.valueMin.m_data[1];
  local_138[2] = local_70.valueMin.m_data[2];
  local_138[3] = local_70.valueMin.m_data[3];
  std::
  vector<de::SharedPtr<vkt::pipeline::TestTexture2DArray>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2DArray>_>_>
  ::reserve((vector<de::SharedPtr<vkt::pipeline::TestTexture2DArray>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2DArray>_>_>
             *)this_00,2);
  iVar18 = 1;
  do {
    this_01 = (TextureFormat)operator_new(0x78);
    local_198.m_data._0_8_ = ::vk::mapVkFormat(*(VkFormat *)(pTVar7[1]._vptr_TestInstance + 4));
    pp_Var10 = pTVar7[1]._vptr_TestInstance;
    vkt::pipeline::TestTexture2DArray::TestTexture2DArray
              ((TestTexture2DArray *)this_01,(TextureFormat *)&local_198,*(int *)(pp_Var10 + 8),
               *(int *)((long)pp_Var10 + 0x44),*(int *)(pp_Var10 + 9));
    uStack_120 = (SharedPtrStateBase *)0x0;
    local_128 = (undefined1  [8])this_01;
    uStack_120 = (SharedPtrStateBase *)operator_new(0x20);
    uStack_120->strongRefCount = 0;
    uStack_120->weakRefCount = 0;
    uStack_120->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d671d0;
    uStack_120[1]._vptr_SharedPtrStateBase = (_func_int **)this_01;
    uStack_120->strongRefCount = 1;
    uStack_120->weakRefCount = 1;
    std::
    vector<de::SharedPtr<vkt::pipeline::TestTexture2DArray>,std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2DArray>>>
    ::emplace_back<de::SharedPtr<vkt::pipeline::TestTexture2DArray>>
              ((vector<de::SharedPtr<vkt::pipeline::TestTexture2DArray>,std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2DArray>>>
                *)this_00,(SharedPtr<vkt::pipeline::TestTexture2DArray> *)local_128);
    if (uStack_120 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &uStack_120->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_128._0_4_ = R;
        local_128._4_4_ = SNORM_INT8;
        (*uStack_120->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &uStack_120->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (uStack_120 != (SharedPtrStateBase *)0x0) {
          (*uStack_120->_vptr_SharedPtrStateBase[1])();
        }
        uStack_120 = (SharedPtrStateBase *)0x0;
      }
    }
    iVar18 = iVar18 + -1;
  } while (iVar18 == 0);
  if (uVar14 != 0) {
    uVar20 = 0;
    if (iVar12 < 1) {
      iVar12 = 0;
    }
    do {
      local_168 = 0xbf000000bf000000;
      uStack_160 = 0x40000000bf000000;
      local_198.m_data[0] = 0.0;
      local_198.m_data[1] = 0.0;
      local_198.m_data[2] = 0.0;
      local_198.m_data[3] = 0.0;
      lVar8 = 0;
      do {
        local_198.m_data[lVar8] = *(float *)((long)&local_168 + lVar8 * 4) * local_158[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      local_128._0_4_ = R;
      local_128._4_4_ = SNORM_INT8;
      uStack_120 = (SharedPtrStateBase *)0x0;
      lVar8 = 0;
      do {
        *(float *)(local_128 + lVar8 * 4) = local_198.m_data[lVar8] + local_138[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      local_148.m_data[0] = 1.0;
      local_148.m_data[1] = 1.0;
      local_148.m_data[2] = 1.0;
      local_148.m_data[3] = 0.0;
      local_168 = 0;
      uStack_160 = 0;
      lVar8 = 0;
      do {
        *(float *)((long)&local_168 + lVar8 * 4) = local_148.m_data[lVar8] * local_158[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      local_198.m_data[0] = 0.0;
      local_198.m_data[1] = 0.0;
      local_198.m_data[2] = 0.0;
      local_198.m_data[3] = 0.0;
      lVar8 = 0;
      do {
        local_198.m_data[lVar8] = *(float *)((long)&local_168 + lVar8 * 4) + local_138[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      lVar8 = (*(code *)(*this_00)->m_testCtx->m_platform[0x11]._vptr_Platform)();
      tcu::fillWithComponentGradients
                ((PixelBufferAccess *)(uVar20 * 0x28 + *(long *)(lVar8 + 0x20)),(Vec4 *)local_128,
                 &local_198);
      uVar20 = uVar20 + 1;
    } while (uVar20 != iVar12 + 1);
    uVar20 = 0;
    do {
      lVar8 = (**(code **)(*(long *)&((*this_00)->m_progCollection->m_programs)._M_t._M_impl + 0x88)
              )();
      uVar14 = (int)(0xffffff / (ulong)(0x20 - uVar13)) * (int)uVar20;
      local_16c = uVar14 | 0xff000000;
      lVar8 = *(long *)(lVar8 + 0x20);
      tcu::RGBA::toVec((RGBA *)&local_168);
      local_170 = ~uVar14 | 0xff000000;
      local_198.m_data[0] = 0.0;
      local_198.m_data[1] = 0.0;
      local_198.m_data[2] = 0.0;
      local_198.m_data[3] = 0.0;
      lVar9 = 0;
      do {
        local_198.m_data[lVar9] = *(float *)((long)&local_168 + lVar9 * 4) * local_158[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
      local_128._0_4_ = R;
      local_128._4_4_ = SNORM_INT8;
      uStack_120 = (SharedPtrStateBase *)0x0;
      lVar9 = 0;
      do {
        *(float *)(local_128 + lVar9 * 4) = local_198.m_data[lVar9] + local_138[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
      tcu::RGBA::toVec(local_80);
      local_98[0] = 0.0;
      local_98[1] = 0.0;
      local_98[2] = 0.0;
      local_98[3] = 0.0;
      lVar9 = 0;
      do {
        local_98[lVar9] = (float)local_80[lVar9].m_value * local_158[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
      local_148.m_data[0] = 0.0;
      local_148.m_data[1] = 0.0;
      local_148.m_data[2] = 0.0;
      local_148.m_data[3] = 0.0;
      lVar9 = 0;
      do {
        local_148.m_data[lVar9] = local_98[lVar9] + local_138[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
      tcu::fillWithGrid((PixelBufferAccess *)(uVar20 * 0x28 + lVar8),4,(Vec4 *)local_128,&local_148)
      ;
      uVar20 = uVar20 + 1;
    } while (uVar20 != iVar12 + 1);
  }
  for (pCVar19 = pTVar7[1].m_context; pCVar19 != (Context *)pTVar7[2]._vptr_TestInstance;
      pCVar19 = (Context *)&pCVar19->m_progCollection) {
    TextureRenderer::add2DArrayTexture(local_180,(TestTexture2DArraySp *)pCVar19);
  }
  afStack_118[3] = 0.0;
  bVar22 = *(int *)pTVar7[1]._vptr_TestInstance - 5U < 2;
  if (!bVar22) {
    afStack_118[3] = 0.5;
  }
  lVar8 = 0;
  local_128 = (undefined1  [8])((ulong)*(uint *)(&DAT_00b84860 + (ulong)bVar22 * 4) << 0x20);
  uStack_120 = (SharedPtrStateBase *)0x4039999a3fcccccd;
  afStack_118[0] = -1.0;
  afStack_118[1] = -2.7;
  afStack_118[2] = 0.0;
  afStack_118[4] = -2.0;
  afStack_118[5] = -1.35;
  afStack_118[6] = -0.2;
  afStack_118[7] = 0.7;
  afStack_118[8] = 1.4013e-45;
  local_f4 = *(uint *)(&DAT_00b84860 + (ulong)bVar22 * 4);
  local_f0 = 0x3e8ccccd3e0f5c29;
  uStack_e8 = 0xbf8ccccdbfc00000;
  local_e0 = 1;
  local_dc = afStack_118[3];
  local_d8 = 0xc028f5c3bf6b851f;
  uStack_d0 = 0xbdcccccd3ecccccd;
  local_c8 = 1;
  local_c4 = 0xbefae1483f8ccccd;
  uStack_bc = 0x3ee66666be6147ae;
  local_b4 = 0x13f7851ec;
  local_ac = 0xbf59999abdcccccd;
  uStack_a4 = 0x3e8000003f400000;
  local_9c = 0x3f1c28f6;
  fVar23 = (float)*(int *)(pTVar7[1]._vptr_TestInstance + 9);
  do {
    iVar12 = *(int *)(local_128 + lVar8 * 0x18);
    uVar2 = *(undefined4 *)(local_128 + lVar8 * 0x18 + 4);
    fVar25 = *(float *)((long)&uStack_120 + lVar8 * 0x18 + 4);
    fVar3 = afStack_118[lVar8 * 6];
    fVar4 = afStack_118[lVar8 * 6 + 1];
    fVar24 = expf(*(float *)(&uStack_120 + lVar8 * 3) * 0.6931472);
    dVar5 = TextureRenderer::getRenderWidth(local_180);
    lVar9 = (*(code *)(&(*this_00)->m_testCtx)[(ulong)(0 < iVar12) * 2]->m_platform[0x11].
                      _vptr_Platform)();
    local_178 = (Context *)CONCAT44(local_178._4_4_,(float)*(int *)(lVar9 + 0x38));
    fVar25 = expf(fVar25 * 0.6931472);
    dVar6 = TextureRenderer::getRenderHeight(local_180);
    lVar9 = (*(code *)(&(*this_00)->m_testCtx)[(ulong)(0 < iVar12) * 2]->m_platform[0x11].
                      _vptr_Platform)();
    fVar24 = (fVar24 * (float)dVar5) / local_178._0_4_ + fVar3;
    fVar25 = (fVar25 * (float)dVar6) / (float)*(int *)(lVar9 + 0x3c) + fVar4;
    pCVar19 = pTVar7[3].m_context;
    if (pCVar19 == (Context *)pTVar7[4]._vptr_TestInstance) {
      pCVar17 = (Context *)pTVar7[3]._vptr_TestInstance;
      if ((long)pCVar19 - (long)pCVar17 == 0x7fffffffffffffe0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar16 = (long)pCVar19 - (long)pCVar17 >> 5;
      uVar20 = uVar16;
      if (pCVar19 == pCVar17) {
        uVar20 = 1;
      }
      uVar15 = uVar20 + uVar16;
      if (0x3fffffffffffffe < uVar15) {
        uVar15 = 0x3ffffffffffffff;
      }
      if (CARRY8(uVar20,uVar16)) {
        uVar15 = 0x3ffffffffffffff;
      }
      if (uVar15 == 0) {
        pp_Var10 = (_func_int **)0x0;
      }
      else {
        local_178 = pCVar17;
        pp_Var10 = (_func_int **)operator_new(uVar15 << 5);
        pCVar17 = local_178;
      }
      *(uint *)(pp_Var10 + uVar16 * 4) = (uint)(0 < iVar12);
      *(float *)((long)pp_Var10 + (uVar16 * 8 + 1) * 4) = fVar3;
      *(float *)(pp_Var10 + uVar16 * 4 + 1) = fVar4;
      *(undefined4 *)((long)pp_Var10 + (uVar16 * 8 + 3) * 4) = 0xbf000000;
      *(float *)(pp_Var10 + uVar16 * 4 + 2) = fVar24;
      *(float *)((long)pp_Var10 + (uVar16 * 8 + 5) * 4) = fVar25;
      *(float *)(pp_Var10 + uVar16 * 4 + 3) = fVar23;
      *(undefined4 *)((long)pp_Var10 + (uVar16 * 8 + 7) * 4) = uVar2;
      pp_Var21 = pp_Var10;
      for (pCVar11 = pCVar17; pCVar19 != pCVar11;
          pCVar11 = (Context *)
                    &(pCVar11->m_device).
                     super_UniqueBase<vkt::DefaultDevice,_de::DefaultDeleter<vkt::DefaultDevice>_>.
                     m_data.field_0x8) {
        *(undefined4 *)pp_Var21 = *(undefined4 *)&pCVar11->m_testCtx;
        lVar9 = 1;
        do {
          *(undefined4 *)((long)pp_Var21 + lVar9 * 4) =
               *(undefined4 *)((long)&pCVar11->m_testCtx + lVar9 * 4);
          lVar9 = lVar9 + 1;
        } while (lVar9 != 4);
        lVar9 = 4;
        do {
          *(undefined4 *)((long)pp_Var21 + lVar9 * 4) =
               *(undefined4 *)((long)&pCVar11->m_testCtx + lVar9 * 4);
          lVar9 = lVar9 + 1;
        } while (lVar9 != 7);
        *(undefined4 *)((long)pp_Var21 + 0x1c) =
             *(undefined4 *)
              ((long)&(pCVar11->m_device).
                      super_UniqueBase<vkt::DefaultDevice,_de::DefaultDeleter<vkt::DefaultDevice>_>.
                      m_data.ptr + 4);
        pp_Var21 = pp_Var21 + 4;
      }
      if (pCVar17 != (Context *)0x0) {
        operator_delete(pCVar17,(long)pTVar7[4]._vptr_TestInstance - (long)pCVar17);
      }
      pTVar7[3]._vptr_TestInstance = pp_Var10;
      pTVar7[3].m_context = (Context *)(pp_Var21 + 4);
      pTVar7[4]._vptr_TestInstance = pp_Var10 + uVar15 * 4;
    }
    else {
      *(uint *)&pCVar19->m_testCtx = (uint)(0 < iVar12);
      *(float *)((long)&pCVar19->m_testCtx + 4) = fVar3;
      *(float *)&pCVar19->m_platformInterface = fVar4;
      *(undefined4 *)((long)&pCVar19->m_platformInterface + 4) = 0xbf000000;
      *(float *)&pCVar19->m_progCollection = fVar24;
      *(float *)((long)&pCVar19->m_progCollection + 4) = fVar25;
      *(float *)&(pCVar19->m_device).
                 super_UniqueBase<vkt::DefaultDevice,_de::DefaultDeleter<vkt::DefaultDevice>_>.
                 m_data.ptr = fVar23;
      *(undefined4 *)
       ((long)&(pCVar19->m_device).
               super_UniqueBase<vkt::DefaultDevice,_de::DefaultDeleter<vkt::DefaultDevice>_>.m_data.
               ptr + 4) = uVar2;
      pTVar7[3].m_context =
           (Context *)
           &(pCVar19->m_device).
            super_UniqueBase<vkt::DefaultDevice,_de::DefaultDeleter<vkt::DefaultDevice>_>.m_data.
            field_0x8;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 6);
  return pTVar7;
}

Assistant:

virtual TestInstance*				createInstance				(Context& context) const
										{
											return new INSTANCE_TYPE(context, m_testsParameters);
										}